

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

errr parser_reg(parser *p,char *fmt,_func_parser_error_parser_ptr *func)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  parser_hook *h;
  char *__s;
  char *pcVar4;
  char *str;
  parser_spec *ppVar5;
  parser_spec *ppVar6;
  errr eVar7;
  uint uVar8;
  
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1eb,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1ec,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  if (func == (_func_parser_error_parser_ptr *)0x0) {
    __assert_fail("func",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1ed,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  h = (parser_hook *)mem_alloc(0x28);
  __s = string_make(fmt);
  h->next = p->hooks;
  h->func = func;
  if (__s == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1a4,"errr parse_specs(struct parser_hook *, char *)");
  }
  pcVar4 = strtok(__s," ");
  eVar7 = -0x16;
  bVar2 = false;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = string_make(pcVar4);
    h->dir = pcVar4;
    h->fhead = (parser_spec *)0x0;
    h->ftail = (parser_spec *)0x0;
    pcVar4 = strtok((char *)0x0," ");
    bVar2 = true;
    if (pcVar4 == (char *)0x0) {
      eVar7 = 0;
    }
    else {
      do {
        str = strtok((char *)0x0," ");
        if (str == (char *)0x0) {
LAB_001b111d:
          clean_specs(h);
          bVar2 = false;
          eVar7 = -0x16;
          goto LAB_001b113a;
        }
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + (cVar1 == '?');
        iVar3 = strcmp(pcVar4,"int");
        uVar8 = (uint)(cVar1 == '?');
        if (iVar3 == 0) {
          uVar8 = uVar8 | 2;
        }
        else {
          iVar3 = strcmp(pcVar4,"sym");
          if (iVar3 == 0) {
            uVar8 = uVar8 | 4;
          }
          else {
            iVar3 = strcmp(pcVar4,"str");
            if (iVar3 == 0) {
              uVar8 = uVar8 | 6;
            }
            else {
              iVar3 = strcmp(pcVar4,"rand");
              if (iVar3 == 0) {
                uVar8 = uVar8 | 8;
              }
              else {
                iVar3 = strcmp(pcVar4,"uint");
                if (iVar3 == 0) {
                  uVar8 = uVar8 | 10;
                }
                else {
                  iVar3 = strcmp(pcVar4,"char");
                  if (iVar3 == 0) {
                    uVar8 = uVar8 | 0xc;
                  }
                  else {
                    uVar8 = 0;
                  }
                }
              }
            }
          }
        }
        if (((uVar8 == 0) ||
            ((((uVar8 & 1) == 0 && (h->ftail != (parser_spec *)0x0)) && ((h->ftail->type & 1) != 0))
            )) || ((h->ftail != (parser_spec *)0x0 && ((h->ftail->type & 0xfffffffeU) == 6))))
        goto LAB_001b111d;
        ppVar5 = (parser_spec *)mem_alloc(0x18);
        ppVar5->type = uVar8;
        pcVar4 = string_make(str);
        ppVar5->name = pcVar4;
        ppVar5->next = (parser_spec *)0x0;
        ppVar6 = (parser_spec *)&h->fhead;
        if (h->fhead != (parser_spec *)0x0) {
          ppVar6 = h->ftail;
        }
        ppVar6->next = ppVar5;
        h->ftail = ppVar5;
        pcVar4 = strtok((char *)0x0," ");
      } while (pcVar4 != (char *)0x0);
      eVar7 = 0;
      bVar2 = true;
    }
  }
LAB_001b113a:
  if (bVar2) {
    p->hooks = h;
    eVar7 = 0;
  }
  else {
    mem_free(h);
  }
  mem_free(__s);
  return eVar7;
}

Assistant:

errr parser_reg(struct parser *p, const char *fmt,
                enum parser_error (*func)(struct parser *p)) {
	errr r;
	char *cfmt;
	struct parser_hook *h;

	assert(p);
	assert(fmt);
	assert(func);

	h = mem_alloc(sizeof *h);
	cfmt = string_make(fmt);
	h->next = p->hooks;
	h->func = func;
	r = parse_specs(h, cfmt);
	if (r)
	{
		mem_free(h);
		mem_free(cfmt);
		return r;
	}

	p->hooks = h;
	mem_free(cfmt);
	return 0;
}